

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c,SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  
  pvVar1 = A->content;
  lVar2 = *(long *)((long)pvVar1 + 8);
  if (0 < lVar2) {
    lVar3 = *(long *)((long)pvVar1 + 0x40);
    lVar4 = *(long *)((long)pvVar1 + 0x20);
    lVar5 = *(long *)((long)pvVar1 + 0x28);
    lVar6 = *(long *)((long)pvVar1 + 0x18);
    lVar7 = 0;
    do {
      pdVar8 = (double *)(*(long *)(lVar3 + lVar7 * 8) + lVar5 * 8);
      lVar9 = -lVar6;
      if (-lVar6 <= lVar4) {
        do {
          pdVar8[lVar9] = pdVar8[lVar9] * c;
          lVar9 = lVar9 + 1;
        } while (lVar4 + 1 != lVar9);
      }
      *pdVar8 = *pdVar8 + 1.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar2);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype* A_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { A_colj[i] *= c; }
    SM_ELEMENT_B(A, j, j) += ONE;
  }
  return SUN_SUCCESS;
}